

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ThreadPool::ThreadPool(ThreadPool *this,size_t n)

{
  worker local_20;
  size_t local_18;
  size_t n_local;
  ThreadPool *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  TaskQueue::TaskQueue(&this->super_TaskQueue);
  (this->super_TaskQueue)._vptr_TaskQueue = (_func_int **)&PTR__ThreadPool_0024b4f0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->threads_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->jobs_);
  this->shutdown_ = false;
  std::condition_variable::condition_variable(&this->cond_);
  std::mutex::mutex(&this->mutex_);
  for (; local_18 != 0; local_18 = local_18 - 1) {
    worker::worker(&local_20,this);
    std::vector<std::thread,_std::allocator<std::thread>_>::
    emplace_back<httplib::ThreadPool::worker>(&this->threads_,&local_20);
  }
  return;
}

Assistant:

explicit ThreadPool(size_t n) : shutdown_(false) {
    while (n) {
      threads_.emplace_back(worker(*this));
      n--;
    }
  }